

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::decrement(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *this)

{
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pair<unsigned_long,_unsigned_long> pos;
  
  uVar7 = (this->current_).second;
  if (this->full_select_ == true) {
    if (1 < uVar7) {
      peVar2 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar9 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_finish - lVar9 >> 4;
      puVar5 = (uint *)(lVar9 + uVar7 * 0x10 + -8);
      do {
        uVar7 = uVar7 - 1;
        if (uVar4 == uVar7) goto LAB_00123bd4;
      } while ((1 < uVar7) && (uVar1 = *puVar5, puVar5 = puVar5 + -4, (uVar1 & this->mask_) == 0));
    }
    uVar4 = uVar7;
    if (uVar7 == 0) {
      uVar4 = 0;
      uVar7 = 0;
    }
    else {
LAB_00123bd4:
      uVar6 = uVar4;
      lVar9 = uVar4 * 0x10 + -8;
      uVar8 = uVar4;
      while (uVar8 = uVar8 - 1, uVar8 != 0) {
        uVar6 = uVar6 - 1;
        peVar2 = (this->map_->index_).
                 super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar3 = (long)(peVar2->
                      super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                      )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar6;
        if ((uVar8 == (long)(peVar2->
                            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                            )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4) ||
           (puVar5 = (uint *)(lVar3 + lVar9), uVar7 = uVar8, lVar9 = lVar9 + -0x10,
           (*puVar5 & this->mask_) != 0)) goto LAB_00123c88;
      }
      uVar7 = 0;
    }
  }
  else {
    uVar4 = uVar7;
    if (1 < uVar7) {
      peVar2 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar9 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_finish - lVar9 >> 4;
      puVar5 = (uint *)(lVar9 + uVar7 * 0x10 + -8);
      do {
        uVar7 = uVar7 - 1;
        uVar4 = uVar8;
        if ((uVar8 == uVar7) || (uVar4 = uVar7, uVar7 < 2)) break;
        uVar1 = *puVar5;
        puVar5 = puVar5 + -4;
      } while ((uVar1 & this->mask_) == 0);
    }
    uVar7 = uVar4 - 1;
  }
LAB_00123c88:
  pos.second = uVar4;
  pos.first = uVar7;
  update_current(this,pos);
  return;
}

Assistant:

void decrement()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second;
                            while(next.first >0) {
                                next.first--;
                                if(valid_offset(next.first))
                                    break;
                            }
                        }
                        else {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second - 1;
                        }
                        update_current(next);
                    }